

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O3

void __thiscall QFileSystemComboBox::setCurrentFileName(QFileSystemComboBox *this,QString *fileName)

{
  QDir local_50 [8];
  QArrayDataPointer<char16_t> local_48;
  QArrayDataPointer<char16_t> local_30;
  
  if ((fileName->d).size != 0) {
    QFileSystemListView::rootPath((QString *)&local_30,this->d->view);
    QDir::QDir(local_50,(QString *)&local_30);
    QDir::filePath((QString *)&local_48);
    setCurrentFilePath(this,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QDir::~QDir(local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
    return;
  }
  QComboBox::setCurrentIndex((int)this);
  return;
}

Assistant:

void QFileSystemComboBox::setCurrentFileName(const QString &fileName) {
    if (fileName.isEmpty()) {
        setCurrentIndex(-1);
    } else {
        setCurrentFilePath(QDir(rootPath()).filePath(fileName));
    }
}